

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# negative_binomial_dist.hpp
# Opt level: O2

int __thiscall trng::negative_binomial_dist::operator()(negative_binomial_dist *this,lcg64_shift *r)

{
  size_t sVar1;
  uint x;
  double dVar2;
  double dVar3;
  
  dVar2 = utility::u01xx_traits<double,_1UL,_trng::lcg64_shift>::co(r);
  sVar1 = utility::
          discrete<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>>
                    (dVar2,(__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>
                            )(this->P).P_.super__Vector_base<double,_std::allocator<double>_>.
                             _M_impl.super__Vector_impl_data._M_start,
                     (__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>)
                     (this->P).P_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_finish);
  if (sVar1 + 1 ==
      (long)(this->P).P_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_finish -
      (long)(this->P).P_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start >> 3) {
    dVar3 = param_type::cdf(&this->P,(int)sVar1);
    for (dVar2 = dVar2 - dVar3; 0.0 < dVar2; dVar2 = dVar2 - dVar3) {
      x = (int)sVar1 + 1;
      sVar1 = (size_t)x;
      dVar3 = param_type::pdf(&this->P,x);
    }
  }
  return (int)sVar1;
}

Assistant:

int operator()(R &r) {
      double p{utility::uniformco<double>(r)};
      const std::size_t x{utility::discrete(p, P.P_.begin(), P.P_.end())};
      int x_i{static_cast<int>(x)};
      if (x + 1 == P.P_.size()) {
        p -= cdf(x_i);
        while (p > 0) {
          ++x_i;
          p -= pdf(x_i);
        }
      }
      return x_i;
    }